

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfInputSetFrameBuffer(ImfInputFile *in,ImfRgba *base,size_t xStride,size_t yStride)

{
  ImfInputFile *in_RDI;
  exception *e;
  size_t in_stack_000001e8;
  size_t in_stack_000001f0;
  Rgba *in_stack_000001f8;
  RgbaInputFile *in_stack_00000200;
  
  anon_unknown.dwarf_572a3::infile(in_RDI);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  return 1;
}

Assistant:

int
ImfInputSetFrameBuffer (
    ImfInputFile* in, ImfRgba* base, size_t xStride, size_t yStride)
{
    try
    {
        infile (in)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}